

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void selectInnerLoop(Parse *pParse,Select *p,ExprList *pEList,int srcTab,SortCtx *pSort,
                    DistinctCtx *pDistinct,SelectDest *pDest,int iContinue,int iBreak)

{
  u8 uVar1;
  byte bVar2;
  ushort uVar3;
  int p1;
  Vdbe *v;
  ExprList *pEVar4;
  byte flags;
  int iVar5;
  uint N;
  int iVar6;
  int iVar7;
  VdbeOp *pVVar8;
  ExprList_item *pEVar9;
  CollSeq *zP4;
  int iVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  uint p2;
  ulong uVar16;
  int local_90;
  
  if (pDistinct == (DistinctCtx *)0x0) {
    uVar1 = '\0';
  }
  else {
    uVar1 = pDistinct->eTnctType;
  }
  if (pSort == (SortCtx *)0x0) {
    pSort = (SortCtx *)0x0;
  }
  else if (pSort->pOrderBy == (ExprList *)0x0) {
    pSort = (SortCtx *)0x0;
  }
  v = pParse->pVdbe;
  bVar2 = pDest->eDest;
  p1 = pDest->iSDParm;
  if (uVar1 == '\0' && pSort == (SortCtx *)0x0) {
    codeOffset(v,p->iOffset,iContinue);
  }
  N = pEList->nExpr;
  iVar7 = pDest->iSdst;
  if (iVar7 == 0) {
    if (pSort == (SortCtx *)0x0) {
      iVar5 = pParse->nMem;
      iVar10 = 0;
    }
    else {
      uVar14._0_1_ = pSort->sortFlags;
      uVar14._1_1_ = pSort->bOrderedInnerLoop;
      uVar14._2_2_ = *(undefined2 *)&pSort->field_0x22;
      iVar10 = (~uVar14 & 1) + pSort->pOrderBy->nExpr;
      iVar5 = pParse->nMem + iVar10;
    }
    iVar7 = iVar5 + 1;
    pDest->iSdst = iVar7;
LAB_0025d8c6:
    pParse->nMem = iVar5 + N;
  }
  else {
    iVar5 = pParse->nMem;
    iVar10 = 0;
    if (iVar5 < (int)(N + iVar7)) goto LAB_0025d8c6;
  }
  pDest->nSdst = N;
  local_90 = iVar7;
  if (srcTab < 0) {
    flags = 1;
    uVar14 = (uint)bVar2;
    if ((1 < uVar14 - 9) && (uVar14 != 0xd)) {
      if (uVar14 == 3) goto LAB_0025d9fe;
      flags = 0;
    }
    if ((uVar1 == '\0' && pSort != (SortCtx *)0x0) && (bVar2 & 0xfd) != 0xc) {
      lVar11 = (long)pSort->nOBSat;
      while (lVar11 < pSort->pOrderBy->nExpr) {
        uVar3 = pSort->pOrderBy->a[lVar11].u.x.iOrderByCol;
        lVar11 = lVar11 + 1;
        if (uVar3 != 0) {
          pEList->a[uVar3 - 1].u.x.iOrderByCol = (short)lVar11 - (short)pSort->nOBSat;
        }
      }
      flags = flags | 0xc;
      local_90 = 0;
    }
    N = sqlite3ExprCodeExprList(pParse,pEList,iVar7,0,flags);
  }
  else {
    p2 = 0;
    uVar14 = 0;
    if (0 < (int)N) {
      uVar14 = N;
    }
    for (; uVar14 != p2; p2 = p2 + 1) {
      sqlite3VdbeAddOp3(v,0x60,srcTab,p2,p2 + iVar7);
    }
  }
LAB_0025d9fe:
  if (uVar1 != '\0') {
    if (pDistinct->eTnctType == '\x01') {
      sqlite3VdbeChangeToNoop(v,pDistinct->addrTnct);
    }
    else if (pDistinct->eTnctType == '\x02') {
      iVar5 = pParse->nMem + 1;
      pParse->nMem = pParse->nMem + N;
      sqlite3VdbeChangeToNoop(v,pDistinct->addrTnct);
      pVVar8 = sqlite3VdbeGetOp(v,pDistinct->addrTnct);
      pVVar8->opcode = ';';
      pVVar8->p1 = 1;
      pVVar8->p2 = iVar5;
      iVar6 = v->nOp;
      pEVar9 = pEList->a;
      uVar13 = 0;
      uVar16 = 0;
      if (0 < (int)N) {
        uVar16 = (ulong)N;
      }
      for (; uVar16 != uVar13; uVar13 = uVar13 + 1) {
        zP4 = sqlite3ExprCollSeq(pParse,pEVar9->pExpr);
        if ((long)uVar13 < (long)(int)(N - 1)) {
          iVar15 = 0x4d;
          iVar12 = iVar6 + N;
        }
        else {
          iVar15 = 0x4e;
          iVar12 = iContinue;
        }
        sqlite3VdbeAddOp3(v,iVar15,iVar7 + (int)uVar13,iVar12,iVar5 + (int)uVar13);
        sqlite3VdbeChangeP4(v,-1,(char *)zP4,-2);
        if (0 < (long)v->nOp) {
          v->aOp[(long)v->nOp + -1].p5 = 0x80;
        }
        pEVar9 = pEVar9 + 1;
      }
      sqlite3VdbeAddOp3(v,0x40,iVar7,iVar5,N - 1);
    }
    else {
      codeDistinct(pParse,pDistinct->tabTnct,iContinue,N,iVar7);
    }
    if (pSort == (SortCtx *)0x0) {
      codeOffset(v,p->iOffset,iContinue);
    }
  }
  switch(bVar2) {
  case 1:
    iVar5 = sqlite3GetTempReg(pParse);
    sqlite3VdbeAddOp3(v,99,iVar7,N,iVar5);
    sqlite3VdbeAddOp4Int(v,0x7e,p1,iVar5,iVar7,N);
    sqlite3ReleaseTempReg(pParse,iVar5);
    break;
  case 2:
    sqlite3VdbeAddOp3(v,0x7f,p1,iVar7,N);
    break;
  case 3:
    sqlite3VdbeAddOp2(v,0x38,1,p1);
    break;
  case 5:
  case 6:
  case 0xc:
  case 0xe:
    iVar5 = sqlite3GetTempRange(pParse,iVar10 + 1);
    sqlite3VdbeAddOp3(v,99,iVar7,N,iVar5 + iVar10);
    if (bVar2 == 6) {
      sqlite3VdbeAddOp4Int(v,0x1e,p1 + 1,v->nOp + 4,iVar5,0);
      sqlite3VdbeAddOp4Int(v,0x7e,p1 + 1,iVar5,iVar7,N);
    }
    if (pSort == (SortCtx *)0x0) {
      iVar7 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v,0x73,p1,iVar7);
      sqlite3VdbeAddOp3(v,0x74,p1,iVar5,iVar7);
      if (0 < (long)v->nOp) {
        v->aOp[(long)v->nOp + -1].p5 = 8;
      }
      sqlite3ReleaseTempReg(pParse,iVar7);
    }
    else {
      pushOntoSorter(pParse,pSort,p,iVar5 + iVar10,iVar7,1,iVar10);
    }
    sqlite3ReleaseTempRange(pParse,iVar5,iVar10 + 1);
    break;
  case 7:
  case 8:
    pEVar4 = pDest->pOrderBy;
    uVar14 = pEVar4->nExpr;
    iVar5 = sqlite3GetTempReg(pParse);
    iVar15 = uVar14 + 2;
    iVar10 = sqlite3GetTempRange(pParse,iVar15);
    iVar12 = iVar10 + uVar14 + 1;
    iVar6 = 0;
    if (bVar2 == 8) {
      iVar6 = sqlite3VdbeAddOp4Int(v,0x1e,p1 + 1,0,iVar7,N);
    }
    sqlite3VdbeAddOp3(v,99,iVar7,N,iVar12);
    if (bVar2 == 8) {
      sqlite3VdbeAddOp2(v,0x7e,p1 + 1,iVar12);
      if (0 < (long)v->nOp) {
        v->aOp[(long)v->nOp + -1].p5 = 0x10;
      }
    }
    uVar16 = 0;
    uVar13 = (ulong)uVar14;
    if ((int)uVar14 < 1) {
      uVar13 = uVar16;
    }
    iVar12 = iVar10;
    for (; uVar13 * 0x20 != uVar16; uVar16 = uVar16 + 0x20) {
      sqlite3VdbeAddOp2(v,0x41,(uint)*(ushort *)((long)&pEVar4->a[0].u + uVar16) + iVar7 + -1,iVar12
                       );
      iVar12 = iVar12 + 1;
    }
    sqlite3VdbeAddOp2(v,0x72,p1,iVar10 + uVar14);
    sqlite3VdbeAddOp3(v,99,iVar10,iVar15,iVar5);
    sqlite3VdbeAddOp4Int(v,0x7e,p1,iVar5,iVar10,iVar15);
    if (iVar6 != 0) {
      sqlite3VdbeJumpHere(v,iVar6);
    }
    sqlite3ReleaseTempReg(pParse,iVar5);
    sqlite3ReleaseTempRange(pParse,iVar10,iVar15);
    break;
  case 9:
  case 0xd:
    if (pSort != (SortCtx *)0x0) {
LAB_0025df58:
      pushOntoSorter(pParse,pSort,p,iVar7,local_90,N,iVar10);
      return;
    }
    if (bVar2 == 0xd) {
      sqlite3VdbeAddOp1(v,0x10,pDest->iSDParm);
    }
    else {
      sqlite3VdbeAddOp2(v,0x43,iVar7,N);
      sqlite3ExprCacheRemove(pParse,iVar7,N);
    }
    goto LAB_0025deba;
  case 10:
    if (pSort != (SortCtx *)0x0) goto LAB_0025df58;
    goto LAB_0025deba;
  case 0xb:
    if (pSort != (SortCtx *)0x0) goto LAB_0025df58;
    iVar5 = sqlite3GetTempReg(pParse);
    sqlite3VdbeAddOp4(v,99,iVar7,N,iVar5,pDest->zAffSdst,N);
    sqlite3ExprCacheRemove(pParse,iVar7,N);
    sqlite3VdbeAddOp4Int(v,0x7e,p1,iVar5,iVar7,N);
    sqlite3ReleaseTempReg(pParse,iVar5);
    goto LAB_0025deba;
  }
  if (pSort == (SortCtx *)0x0) {
LAB_0025deba:
    if (p->iLimit != 0) {
      sqlite3VdbeAddOp2(v,0x30,p->iLimit,iBreak);
      return;
    }
  }
  return;
}

Assistant:

static void selectInnerLoop(
  Parse *pParse,          /* The parser context */
  Select *p,              /* The complete select statement being coded */
  ExprList *pEList,       /* List of values being extracted */
  int srcTab,             /* Pull data from this table */
  SortCtx *pSort,         /* If not NULL, info on how to process ORDER BY */
  DistinctCtx *pDistinct, /* If not NULL, info on how to process DISTINCT */
  SelectDest *pDest,      /* How to dispose of the results */
  int iContinue,          /* Jump here to continue with next row */
  int iBreak              /* Jump here to break out of the inner loop */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  int hasDistinct;            /* True if the DISTINCT keyword is present */
  int eDest = pDest->eDest;   /* How to dispose of results */
  int iParm = pDest->iSDParm; /* First argument to disposal method */
  int nResultCol;             /* Number of result columns */
  int nPrefixReg = 0;         /* Number of extra registers before regResult */

  /* Usually, regResult is the first cell in an array of memory cells
  ** containing the current result row. In this case regOrig is set to the
  ** same value. However, if the results are being sent to the sorter, the
  ** values for any expressions that are also part of the sort-key are omitted
  ** from this array. In this case regOrig is set to zero.  */
  int regResult;              /* Start of memory holding current results */
  int regOrig;                /* Start of memory holding full result (or 0) */

  assert( v );
  assert( pEList!=0 );
  hasDistinct = pDistinct ? pDistinct->eTnctType : WHERE_DISTINCT_NOOP;
  if( pSort && pSort->pOrderBy==0 ) pSort = 0;
  if( pSort==0 && !hasDistinct ){
    assert( iContinue!=0 );
    codeOffset(v, p->iOffset, iContinue);
  }

  /* Pull the requested columns.
  */
  nResultCol = pEList->nExpr;

  if( pDest->iSdst==0 ){
    if( pSort ){
      nPrefixReg = pSort->pOrderBy->nExpr;
      if( !(pSort->sortFlags & SORTFLAG_UseSorter) ) nPrefixReg++;
      pParse->nMem += nPrefixReg;
    }
    pDest->iSdst = pParse->nMem+1;
    pParse->nMem += nResultCol;
  }else if( pDest->iSdst+nResultCol > pParse->nMem ){
    /* This is an error condition that can result, for example, when a SELECT
    ** on the right-hand side of an INSERT contains more result columns than
    ** there are columns in the table on the left.  The error will be caught
    ** and reported later.  But we need to make sure enough memory is allocated
    ** to avoid other spurious errors in the meantime. */
    pParse->nMem += nResultCol;
  }
  pDest->nSdst = nResultCol;
  regOrig = regResult = pDest->iSdst;
  if( srcTab>=0 ){
    for(i=0; i<nResultCol; i++){
      sqlite3VdbeAddOp3(v, OP_Column, srcTab, i, regResult+i);
      VdbeComment((v, "%s", pEList->a[i].zName));
    }
  }else if( eDest!=SRT_Exists ){
    /* If the destination is an EXISTS(...) expression, the actual
    ** values returned by the SELECT are not required.
    */
    u8 ecelFlags;
    if( eDest==SRT_Mem || eDest==SRT_Output || eDest==SRT_Coroutine ){
      ecelFlags = SQLITE_ECEL_DUP;
    }else{
      ecelFlags = 0;
    }
    if( pSort && hasDistinct==0 && eDest!=SRT_EphemTab && eDest!=SRT_Table ){
      /* For each expression in pEList that is a copy of an expression in
      ** the ORDER BY clause (pSort->pOrderBy), set the associated 
      ** iOrderByCol value to one more than the index of the ORDER BY 
      ** expression within the sort-key that pushOntoSorter() will generate.
      ** This allows the pEList field to be omitted from the sorted record,
      ** saving space and CPU cycles.  */
      ecelFlags |= (SQLITE_ECEL_OMITREF|SQLITE_ECEL_REF);
      for(i=pSort->nOBSat; i<pSort->pOrderBy->nExpr; i++){
        int j;
        if( (j = pSort->pOrderBy->a[i].u.x.iOrderByCol)>0 ){
          pEList->a[j-1].u.x.iOrderByCol = i+1-pSort->nOBSat;
        }
      }
      regOrig = 0;
      assert( eDest==SRT_Set || eDest==SRT_Mem 
           || eDest==SRT_Coroutine || eDest==SRT_Output );
    }
    nResultCol = sqlite3ExprCodeExprList(pParse,pEList,regResult,0,ecelFlags);
  }

  /* If the DISTINCT keyword was present on the SELECT statement
  ** and this row has been seen before, then do not make this row
  ** part of the result.
  */
  if( hasDistinct ){
    switch( pDistinct->eTnctType ){
      case WHERE_DISTINCT_ORDERED: {
        VdbeOp *pOp;            /* No longer required OpenEphemeral instr. */
        int iJump;              /* Jump destination */
        int regPrev;            /* Previous row content */

        /* Allocate space for the previous row */
        regPrev = pParse->nMem+1;
        pParse->nMem += nResultCol;

        /* Change the OP_OpenEphemeral coded earlier to an OP_Null
        ** sets the MEM_Cleared bit on the first register of the
        ** previous value.  This will cause the OP_Ne below to always
        ** fail on the first iteration of the loop even if the first
        ** row is all NULLs.
        */
        sqlite3VdbeChangeToNoop(v, pDistinct->addrTnct);
        pOp = sqlite3VdbeGetOp(v, pDistinct->addrTnct);
        pOp->opcode = OP_Null;
        pOp->p1 = 1;
        pOp->p2 = regPrev;

        iJump = sqlite3VdbeCurrentAddr(v) + nResultCol;
        for(i=0; i<nResultCol; i++){
          CollSeq *pColl = sqlite3ExprCollSeq(pParse, pEList->a[i].pExpr);
          if( i<nResultCol-1 ){
            sqlite3VdbeAddOp3(v, OP_Ne, regResult+i, iJump, regPrev+i);
            VdbeCoverage(v);
          }else{
            sqlite3VdbeAddOp3(v, OP_Eq, regResult+i, iContinue, regPrev+i);
            VdbeCoverage(v);
           }
          sqlite3VdbeChangeP4(v, -1, (const char *)pColl, P4_COLLSEQ);
          sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
        }
        assert( sqlite3VdbeCurrentAddr(v)==iJump || pParse->db->mallocFailed );
        sqlite3VdbeAddOp3(v, OP_Copy, regResult, regPrev, nResultCol-1);
        break;
      }

      case WHERE_DISTINCT_UNIQUE: {
        sqlite3VdbeChangeToNoop(v, pDistinct->addrTnct);
        break;
      }

      default: {
        assert( pDistinct->eTnctType==WHERE_DISTINCT_UNORDERED );
        codeDistinct(pParse, pDistinct->tabTnct, iContinue, nResultCol,
                     regResult);
        break;
      }
    }
    if( pSort==0 ){
      codeOffset(v, p->iOffset, iContinue);
    }
  }

  switch( eDest ){
    /* In this mode, write each query result to the key of the temporary
    ** table iParm.
    */
#ifndef SQLITE_OMIT_COMPOUND_SELECT
    case SRT_Union: {
      int r1;
      r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, regResult, nResultCol);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

    /* Construct a record from the query result, but instead of
    ** saving that record, use it as a key to delete elements from
    ** the temporary table iParm.
    */
    case SRT_Except: {
      sqlite3VdbeAddOp3(v, OP_IdxDelete, iParm, regResult, nResultCol);
      break;
    }
#endif /* SQLITE_OMIT_COMPOUND_SELECT */

    /* Store the result as data using a unique key.
    */
    case SRT_Fifo:
    case SRT_DistFifo:
    case SRT_Table:
    case SRT_EphemTab: {
      int r1 = sqlite3GetTempRange(pParse, nPrefixReg+1);
      testcase( eDest==SRT_Table );
      testcase( eDest==SRT_EphemTab );
      testcase( eDest==SRT_Fifo );
      testcase( eDest==SRT_DistFifo );
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r1+nPrefixReg);
#ifndef SQLITE_OMIT_CTE
      if( eDest==SRT_DistFifo ){
        /* If the destination is DistFifo, then cursor (iParm+1) is open
        ** on an ephemeral index. If the current row is already present
        ** in the index, do not write it to the output. If not, add the
        ** current row to the index and proceed with writing it to the
        ** output table as well.  */
        int addr = sqlite3VdbeCurrentAddr(v) + 4;
        sqlite3VdbeAddOp4Int(v, OP_Found, iParm+1, addr, r1, 0);
        VdbeCoverage(v);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm+1, r1,regResult,nResultCol);
        assert( pSort==0 );
      }
#endif
      if( pSort ){
        pushOntoSorter(pParse, pSort, p, r1+nPrefixReg,regResult,1,nPrefixReg);
      }else{
        int r2 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_NewRowid, iParm, r2);
        sqlite3VdbeAddOp3(v, OP_Insert, iParm, r1, r2);
        sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      sqlite3ReleaseTempRange(pParse, r1, nPrefixReg+1);
      break;
    }

#ifndef SQLITE_OMIT_SUBQUERY
    /* If we are creating a set for an "expr IN (SELECT ...)" construct,
    ** then there should be a single item on the stack.  Write this
    ** item into the set table with bogus data.
    */
    case SRT_Set: {
      if( pSort ){
        /* At first glance you would think we could optimize out the
        ** ORDER BY in this case since the order of entries in the set
        ** does not matter.  But there might be a LIMIT clause, in which
        ** case the order does matter */
        pushOntoSorter(
            pParse, pSort, p, regResult, regOrig, nResultCol, nPrefixReg);
      }else{
        int r1 = sqlite3GetTempReg(pParse);
        assert( sqlite3Strlen30(pDest->zAffSdst)==nResultCol );
        sqlite3VdbeAddOp4(v, OP_MakeRecord, regResult, nResultCol, 
            r1, pDest->zAffSdst, nResultCol);
        sqlite3ExprCacheAffinityChange(pParse, regResult, nResultCol);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, regResult, nResultCol);
        sqlite3ReleaseTempReg(pParse, r1);
      }
      break;
    }

    /* If any row exist in the result set, record that fact and abort.
    */
    case SRT_Exists: {
      sqlite3VdbeAddOp2(v, OP_Integer, 1, iParm);
      /* The LIMIT clause will terminate the loop for us */
      break;
    }

    /* If this is a scalar select that is part of an expression, then
    ** store the results in the appropriate memory cell or array of 
    ** memory cells and break out of the scan loop.
    */
    case SRT_Mem: {
      if( pSort ){
        assert( nResultCol<=pDest->nSdst );
        pushOntoSorter(
            pParse, pSort, p, regResult, regOrig, nResultCol, nPrefixReg);
      }else{
        assert( nResultCol==pDest->nSdst );
        assert( regResult==iParm );
        /* The LIMIT clause will jump out of the loop for us */
      }
      break;
    }
#endif /* #ifndef SQLITE_OMIT_SUBQUERY */

    case SRT_Coroutine:       /* Send data to a co-routine */
    case SRT_Output: {        /* Return the results */
      testcase( eDest==SRT_Coroutine );
      testcase( eDest==SRT_Output );
      if( pSort ){
        pushOntoSorter(pParse, pSort, p, regResult, regOrig, nResultCol,
                       nPrefixReg);
      }else if( eDest==SRT_Coroutine ){
        sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      }else{
        sqlite3VdbeAddOp2(v, OP_ResultRow, regResult, nResultCol);
        sqlite3ExprCacheAffinityChange(pParse, regResult, nResultCol);
      }
      break;
    }

#ifndef SQLITE_OMIT_CTE
    /* Write the results into a priority queue that is order according to
    ** pDest->pOrderBy (in pSO).  pDest->iSDParm (in iParm) is the cursor for an
    ** index with pSO->nExpr+2 columns.  Build a key using pSO for the first
    ** pSO->nExpr columns, then make sure all keys are unique by adding a
    ** final OP_Sequence column.  The last column is the record as a blob.
    */
    case SRT_DistQueue:
    case SRT_Queue: {
      int nKey;
      int r1, r2, r3;
      int addrTest = 0;
      ExprList *pSO;
      pSO = pDest->pOrderBy;
      assert( pSO );
      nKey = pSO->nExpr;
      r1 = sqlite3GetTempReg(pParse);
      r2 = sqlite3GetTempRange(pParse, nKey+2);
      r3 = r2+nKey+1;
      if( eDest==SRT_DistQueue ){
        /* If the destination is DistQueue, then cursor (iParm+1) is open
        ** on a second ephemeral index that holds all values every previously
        ** added to the queue. */
        addrTest = sqlite3VdbeAddOp4Int(v, OP_Found, iParm+1, 0, 
                                        regResult, nResultCol);
        VdbeCoverage(v);
      }
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r3);
      if( eDest==SRT_DistQueue ){
        sqlite3VdbeAddOp2(v, OP_IdxInsert, iParm+1, r3);
        sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
      }
      for(i=0; i<nKey; i++){
        sqlite3VdbeAddOp2(v, OP_SCopy,
                          regResult + pSO->a[i].u.x.iOrderByCol - 1,
                          r2+i);
      }
      sqlite3VdbeAddOp2(v, OP_Sequence, iParm, r2+nKey);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, r2, nKey+2, r1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, r2, nKey+2);
      if( addrTest ) sqlite3VdbeJumpHere(v, addrTest);
      sqlite3ReleaseTempReg(pParse, r1);
      sqlite3ReleaseTempRange(pParse, r2, nKey+2);
      break;
    }
#endif /* SQLITE_OMIT_CTE */



#if !defined(SQLITE_OMIT_TRIGGER)
    /* Discard the results.  This is used for SELECT statements inside
    ** the body of a TRIGGER.  The purpose of such selects is to call
    ** user-defined functions that have side effects.  We do not care
    ** about the actual results of the select.
    */
    default: {
      assert( eDest==SRT_Discard );
      break;
    }
#endif
  }

  /* Jump to the end of the loop if the LIMIT is reached.  Except, if
  ** there is a sorter, in which case the sorter has already limited
  ** the output for us.
  */
  if( pSort==0 && p->iLimit ){
    sqlite3VdbeAddOp2(v, OP_DecrJumpZero, p->iLimit, iBreak); VdbeCoverage(v);
  }
}